

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract.cpp
# Opt level: O3

void __thiscall
ContractFrame::CheckPrecondition(ContractFrame *this,bool expr,char *stringifed_expr)

{
  long *plVar1;
  size_type *psVar2;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_type *local_70;
  string panic_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((int)CONCAT71(in_register_00000031,expr) != 0) {
    return;
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"precondition failed in function \'","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_b0);
  panic_msg.field_2._8_8_ = *plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)panic_msg.field_2._8_8_ == psVar2) {
    local_40._M_allocated_capacity = *psVar2;
    local_40._8_8_ = plVar1[3];
    panic_msg.field_2._8_8_ = &local_40;
  }
  else {
    local_40._M_allocated_capacity = *psVar2;
  }
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_90.field_2._M_allocated_capacity._0_4_ = 0x203a27;
  local_90._M_string_length = 3;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&panic_msg.field_2 + 8),&local_90);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_70 = (size_type *)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if (local_70 == psVar2) {
    panic_msg._M_string_length = *psVar2;
    panic_msg.field_2._M_allocated_capacity = plVar1[3];
    local_70 = &panic_msg._M_string_length;
  }
  else {
    panic_msg._M_string_length = *psVar2;
  }
  panic_msg._M_dataplus._M_p = (pointer)plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT44(local_90.field_2._M_allocated_capacity._4_4_,
                             local_90.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)panic_msg.field_2._8_8_ != &local_40) {
    operator_delete((void *)panic_msg.field_2._8_8_,local_40._M_allocated_capacity + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/contract.cpp"
            ,0x27,"CheckPrecondition",(char *)local_70);
}

Assistant:

void ContractFrame::CheckPrecondition(bool expr, const char *stringifed_expr) {
  if (!expr) {
    std::string panic_msg = "precondition failed in function '"s +
                            function_name + "': "s + stringifed_expr;
    PANIC(panic_msg.c_str());
  }
}